

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

int64_t __thiscall mkvmuxer::Segment::MaxOffset(Segment *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t uVar2;
  undefined4 extraout_var_00;
  int64_t iVar3;
  int32_t i;
  long lVar4;
  
  if (this->writer_header_ == (IMkvWriter *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar1 = (*this->writer_header_->_vptr_IMkvWriter[1])();
    iVar3 = CONCAT44(extraout_var,iVar1) - this->payload_pos_;
    if (this->chunking_ == true) {
      for (lVar4 = 0; lVar4 < this->cluster_list_size_; lVar4 = lVar4 + 1) {
        uVar2 = Cluster::Size(this->cluster_list_[lVar4]);
        iVar3 = iVar3 + uVar2;
      }
      if (this->writer_cues_ != (IMkvWriter *)0x0) {
        iVar1 = (*this->writer_cues_->_vptr_IMkvWriter[1])();
        iVar3 = iVar3 + CONCAT44(extraout_var_00,iVar1);
      }
    }
  }
  return iVar3;
}

Assistant:

int64_t Segment::MaxOffset() {
  if (!writer_header_)
    return -1;

  int64_t offset = writer_header_->Position() - payload_pos_;

  if (chunking_) {
    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      Cluster* const cluster = cluster_list_[i];
      offset += cluster->Size();
    }

    if (writer_cues_)
      offset += writer_cues_->Position();
  }

  return offset;
}